

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindow::QMdiSubWindow(QMdiSubWindow *this,QWidget *parent,WindowFlags flags)

{
  ColorGroup CVar1;
  undefined4 uVar2;
  QPalettePrivate *pQVar3;
  QIconPrivate *pQVar4;
  char cVar5;
  QMdiSubWindowPrivate *pQVar6;
  QLayout *pQVar7;
  QStyle *pQVar8;
  long in_FS_OFFSET;
  QObject local_50 [8];
  undefined1 local_48 [8];
  QAction **ppQStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = (QMdiSubWindowPrivate *)operator_new(0x470);
  QMdiSubWindowPrivate::QMdiSubWindowPrivate(pQVar6);
  QWidget::QWidget(&this->super_QWidget,(QWidgetPrivate *)pQVar6,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007d04a0;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QMdiSubWindow_007d0650;
  pQVar6 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  QMdiSubWindowPrivate::createSystemMenu(pQVar6);
  QWidget::actions((QList<QAction_*> *)local_48,(QWidget *)(pQVar6->systemMenu).wp.value);
  QWidget::addActions(&this->super_QWidget,(QList<QAction_*> *)local_48);
  QArrayDataPointer<QAction_*>::~QArrayDataPointer((QArrayDataPointer<QAction_*> *)local_48);
  (**(code **)(*(long *)&pQVar6->super_QWidgetPrivate + 0x28))
            (pQVar6,flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                    super_QFlagsStorage<Qt::WindowType>.i);
  QWidget::setBackgroundRole(&this->super_QWidget,Window);
  QWidget::setAutoFillBackground(&this->super_QWidget,true);
  QWidget::setMouseTracking(&this->super_QWidget,true);
  pQVar7 = (QLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)pQVar7);
  QWidget::setLayout(&this->super_QWidget,pQVar7);
  QWidget::setFocusPolicy(&this->super_QWidget,StrongFocus);
  pQVar7 = QWidget::layout(&this->super_QWidget);
  local_48 = (undefined1  [8])0x0;
  ppQStack_40 = (QAction **)0x0;
  QLayout::setContentsMargins(pQVar7,(QMargins *)local_48);
  QMdiSubWindowPrivate::updateGeometryConstraints(pQVar6);
  QWidget::setAttribute(&this->super_QWidget,WA_Resized,false);
  QMdiSubWindowPrivate::desktopPalette((QMdiSubWindowPrivate *)local_48);
  CVar1 = (pQVar6->titleBarPalette).currentGroup;
  (pQVar6->titleBarPalette).currentGroup = ppQStack_40._0_4_;
  pQVar3 = (pQVar6->titleBarPalette).d;
  (pQVar6->titleBarPalette).d = (QPalettePrivate *)local_48;
  local_48 = (undefined1  [8])pQVar3;
  ppQStack_40._0_4_ = CVar1;
  QPalette::~QPalette((QPalette *)local_48);
  QApplication::font((QApplication *)local_48,"QMdiSubWindowTitleBar");
  pQVar4 = *(QIconPrivate **)&pQVar6->font;
  *(undefined1 (*) [8])&pQVar6->font = local_48;
  uVar2 = *(undefined4 *)&pQVar6->field_0x3d8;
  *(int *)&pQVar6->field_0x3d8 = ppQStack_40._0_4_;
  ppQStack_40 = (QAction **)CONCAT44(ppQStack_40._4_4_,uVar2);
  local_48 = (undefined1  [8])pQVar4;
  QFont::~QFont((QFont *)local_48);
  QWidget::windowIcon((QWidget *)local_48);
  cVar5 = QIcon::isNull();
  QIcon::~QIcon((QIcon *)local_48);
  if (cVar5 == '\0') {
    QWidget::windowIcon((QWidget *)local_48);
  }
  else {
    pQVar8 = QWidget::style(&this->super_QWidget);
    (**(code **)(*(long *)pQVar8 + 0x100))(local_48,pQVar8,0,0,this);
  }
  QIcon::operator=(&pQVar6->menuIcon,(QIcon *)local_48);
  QIcon::~QIcon((QIcon *)local_48);
  QObject::connect(local_50,QCoreApplication::self,(QObject *)"2focusChanged(QWidget*,QWidget*)",
                   (char *)this,0x66026f);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMdiSubWindow::QMdiSubWindow(QWidget *parent, Qt::WindowFlags flags)
    : QWidget(*new QMdiSubWindowPrivate, parent, { })
{
    Q_D(QMdiSubWindow);
#if QT_CONFIG(menu)
    d->createSystemMenu();
    addActions(d->systemMenu->actions());
#endif
    d->setWindowFlags(flags);
    setBackgroundRole(QPalette::Window);
    setAutoFillBackground(true);
    setMouseTracking(true);
    setLayout(new QVBoxLayout);
    setFocusPolicy(Qt::StrongFocus);
    layout()->setContentsMargins(QMargins());
    d->updateGeometryConstraints();
    setAttribute(Qt::WA_Resized, false);
    d->titleBarPalette = d->desktopPalette();
    d->font = QApplication::font("QMdiSubWindowTitleBar");
    // We don't want the menu icon by default on mac.
#ifndef Q_OS_MAC
    if (windowIcon().isNull())
        d->menuIcon = style()->standardIcon(QStyle::SP_TitleBarMenuButton, nullptr, this);
    else
        d->menuIcon = windowIcon();
#endif
    connect(qApp, SIGNAL(focusChanged(QWidget*,QWidget*)),
            this, SLOT(_q_processFocusChanged(QWidget*,QWidget*)));
}